

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::setNativeWindowVisibility(QWidgetWindow *this,bool visible)

{
  byte bVar1;
  bool bVar2;
  QWidgetWindowPrivate *file;
  QDebug *o;
  byte in_SIL;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *in_RDI;
  long in_FS_OFFSET;
  QWidgetWindowPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_ffffffffffffffa0;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  QDebug local_30;
  QDebug in_stack_ffffffffffffffd8;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_SIL & 1;
  this_00 = in_RDI;
  file = d_func((QWidgetWindow *)0x3b3743);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcWidgetShowHide();
  anon_unknown.dwarf_2d15b0::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            (in_RDI,(QLoggingCategory *)
                    CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  while( true ) {
    bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar2) break;
    anon_unknown.dwarf_2d15b0::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x3b378f);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),(char *)file,
               (int)((ulong)in_RDI >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
               (char *)0x3b37a5);
    QMessageLogger::debug();
    o = QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::QDebug((QDebug *)&stack0xffffffffffffffd8,o);
    ::operator<<((QDebug *)&local_20,(QWindow *)&stack0xffffffffffffffd8);
    QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::operator<<((QDebug *)in_RDI,(bool)in_stack_ffffffffffffff8f);
    QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffffd8.stream);
    QDebug::~QDebug(&local_20);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffd8);
    QDebug::~QDebug(&local_30);
    local_10 = 0;
  }
  QWindowPrivate::setVisible(SUB81(file,0));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::setNativeWindowVisibility(bool visible)
{
    Q_D(QWidgetWindow);
    qCDebug(lcWidgetShowHide) << "Setting visibility of" << this
        << "to" << visible << "via QWidgetWindow::setNativeWindowVisibility";

    // Call base class setVisible() implementation to run the QWindow
    // visibility logic. Don't call QWidgetWindowPrivate::setVisible()
    // since that will recurse back into QWidget code.
    d->QWindowPrivate::setVisible(visible);
}